

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aes_ccm_tls_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  CCM128_CONTEXT *ctx_00;
  uchar *puVar2;
  ccm128_f stream;
  uchar *puVar3;
  size_t sVar4;
  ulong in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uchar tag [16];
  CCM128_CONTEXT *ccm;
  EVP_AES_CCM_CTX *cctx;
  CCM128_CONTEXT *ctx_01;
  uchar *in_stack_ffffffffffffffb0;
  CCM128_CONTEXT *in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  CCM128_CONTEXT *aad;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  ctx_00 = (CCM128_CONTEXT *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  ctx_01 = ctx_00 + 5;
  if ((in_RSI == in_RDX) && ((long)*(int *)((long)&ctx_00[4].block + 4) + 8U <= in_RCX)) {
    iVar5 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    puVar3 = in_RSI;
    if (iVar5 != 0) {
      puVar2 = EVP_CIPHER_CTX_buf_noconst(in_RDI);
      *(undefined8 *)in_RSI = *(undefined8 *)puVar2;
      in_stack_ffffffffffffffb0 = in_RSI;
    }
    *(undefined8 *)(in_RDI->iv + 4) = *(undefined8 *)in_RDX;
    stream = (ccm128_f)(in_RCX - (long)(*(int *)((long)&ctx_00[4].block + 4) + 8));
    iVar5 = CRYPTO_ccm128_setiv(ctx_01,in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                                (size_t)in_stack_ffffffffffffffb0);
    if (iVar5 == 0) {
      aad = ctx_01;
      EVP_CIPHER_CTX_buf_noconst(in_RDI);
      CRYPTO_ccm128_aad(ctx_00,(uchar *)aad,(size_t)in_stack_ffffffffffffffc0);
      in_RDX = in_RDX + 8;
      puVar3 = puVar3 + 8;
      iVar5 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      if (iVar5 == 0) {
        if (ctx_00[6].nonce.u[0] == 0) {
          iVar5 = CRYPTO_ccm128_decrypt
                            ((CCM128_CONTEXT *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (uchar *)in_RDI,puVar3,(size_t)in_RDX);
        }
        else {
          iVar5 = CRYPTO_ccm128_decrypt_ccm64
                            ((CCM128_CONTEXT *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (uchar *)in_RDI,puVar3,(size_t)in_RDX,stream);
        }
        if (((iVar5 == 0) &&
            (sVar4 = CRYPTO_ccm128_tag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                       (size_t)ctx_01), sVar4 != 0)) &&
           (iVar5 = CRYPTO_memcmp(&stack0xffffffffffffffb8,in_RDX + (long)stream,
                                  (long)*(int *)((long)&ctx_00[4].block + 4)), iVar5 == 0)) {
          iVar5 = (int)stream;
        }
        else {
          OPENSSL_cleanse(puVar3,(size_t)stream);
          iVar5 = -1;
        }
      }
      else {
        if (ctx_00[6].nonce.u[0] == 0) {
          iVar1 = CRYPTO_ccm128_encrypt
                            ((CCM128_CONTEXT *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (uchar *)in_RDI,puVar3,(size_t)in_RDX);
          iVar5 = (int)stream;
        }
        else {
          iVar1 = CRYPTO_ccm128_encrypt_ccm64
                            ((CCM128_CONTEXT *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (uchar *)in_RDI,puVar3,(size_t)in_RDX,stream);
          iVar5 = (int)stream;
        }
        if (iVar1 == 0) {
          sVar4 = CRYPTO_ccm128_tag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                    (size_t)ctx_01);
          if (sVar4 == 0) {
            iVar5 = -1;
          }
          else {
            iVar5 = iVar5 + 8 + *(int *)((long)&ctx_00[4].block + 4);
          }
        }
        else {
          iVar5 = -1;
        }
      }
    }
    else {
      iVar5 = -1;
    }
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int aes_ccm_tls_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                              const unsigned char *in, size_t len)
{
    EVP_AES_CCM_CTX *cctx = EVP_C_DATA(EVP_AES_CCM_CTX,ctx);
    CCM128_CONTEXT *ccm = &cctx->ccm;
    /* Encrypt/decrypt must be performed in place */
    if (out != in || len < (EVP_CCM_TLS_EXPLICIT_IV_LEN + (size_t)cctx->M))
        return -1;
    /* If encrypting set explicit IV from sequence number (start of AAD) */
    if (EVP_CIPHER_CTX_is_encrypting(ctx))
        memcpy(out, EVP_CIPHER_CTX_buf_noconst(ctx),
               EVP_CCM_TLS_EXPLICIT_IV_LEN);
    /* Get rest of IV from explicit IV */
    memcpy(ctx->iv + EVP_CCM_TLS_FIXED_IV_LEN, in,
           EVP_CCM_TLS_EXPLICIT_IV_LEN);
    /* Correct length value */
    len -= EVP_CCM_TLS_EXPLICIT_IV_LEN + cctx->M;
    if (CRYPTO_ccm128_setiv(ccm, ctx->iv, 15 - cctx->L,
                            len))
            return -1;
    /* Use saved AAD */
    CRYPTO_ccm128_aad(ccm, EVP_CIPHER_CTX_buf_noconst(ctx),
                      cctx->tls_aad_len);
    /* Fix buffer to point to payload */
    in += EVP_CCM_TLS_EXPLICIT_IV_LEN;
    out += EVP_CCM_TLS_EXPLICIT_IV_LEN;
    if (EVP_CIPHER_CTX_is_encrypting(ctx)) {
        if (cctx->str ? CRYPTO_ccm128_encrypt_ccm64(ccm, in, out, len,
                                                    cctx->str) :
            CRYPTO_ccm128_encrypt(ccm, in, out, len))
            return -1;
        if (!CRYPTO_ccm128_tag(ccm, out + len, cctx->M))
            return -1;
        return len + EVP_CCM_TLS_EXPLICIT_IV_LEN + cctx->M;
    } else {
        if (cctx->str ? !CRYPTO_ccm128_decrypt_ccm64(ccm, in, out, len,
                                                     cctx->str) :
            !CRYPTO_ccm128_decrypt(ccm, in, out, len)) {
            unsigned char tag[16];
            if (CRYPTO_ccm128_tag(ccm, tag, cctx->M)) {
                if (!CRYPTO_memcmp(tag, in + len, cctx->M))
                    return len;
            }
        }
        OPENSSL_cleanse(out, len);
        return -1;
    }
}